

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

void deflate_compress_greedy
               (libdeflate_compressor *c,u8 *in,size_t in_nbytes,deflate_output_bitstream *os)

{
  undefined8 *puVar1;
  uint *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  int *piVar5;
  u32 *puVar6;
  byte bVar7;
  short sVar8;
  ulong uVar9;
  ushort uVar10;
  _Bool _Var11;
  u32 uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  u32 uVar18;
  byte *pbVar19;
  uint *puVar20;
  uint *puVar21;
  uint uVar22;
  uint uVar23;
  uint *puVar24;
  short sVar25;
  ushort uVar26;
  ulong uVar27;
  ulong uVar28;
  uint *puVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint local_ac;
  u8 *local_a0;
  uint local_84;
  long local_80;
  int local_78;
  ulong local_70;
  
  local_ac = c->nice_match_length;
  lVar16 = 0x17c0;
  do {
    puVar1 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + -0x28);
    *puVar1 = 0x8000800080008000;
    puVar1[1] = 0x8000800080008000;
    puVar1 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + -0x18);
    *puVar1 = 0x8000800080008000;
    puVar1[1] = 0x8000800080008000;
    puVar1 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + -8);
    *puVar1 = 0x8000800080008000;
    puVar1[1] = 0x8000800080008000;
    puVar1 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + 8);
    *puVar1 = 0x8000800080008000;
    puVar1[1] = 0x8000800080008000;
    lVar16 = lVar16 + 0x40;
  } while (lVar16 != 0x317c0);
  puVar20 = (uint *)(in + in_nbytes);
  local_70 = 0x102;
  if (0x101 < local_ac) {
    local_ac = 0x102;
  }
  uVar22 = 0;
  uVar28 = 0;
  local_a0 = in;
LAB_00101d60:
  puVar24 = (uint *)((long)in + 300000);
  if ((ulong)((long)puVar20 - (long)in) < 0x4a768) {
    puVar24 = puVar20;
  }
  init_block_split_stats(&c->split_stats);
  memset(&c->freqs,0,0x500);
  (c->p).g.sequences[0].litrunlen_and_length = 0;
  uVar12 = calculate_min_match_len(in,(long)puVar24 - (long)in,c->max_search_depth);
  uVar13 = uVar12 - 1;
  local_80 = 0x417c0;
  puVar29 = (uint *)in;
  auVar32 = _DAT_0010c040;
LAB_00101dea:
  uVar17 = (long)puVar20 - (long)puVar29;
  if (uVar17 < 0x102) {
    if ((uint)uVar17 <= local_ac) {
      local_ac = (uint)uVar17;
    }
    local_70 = uVar17 & 0xffffffff;
  }
  uVar18 = c->max_search_depth;
  uVar14 = (int)puVar29 - (int)local_a0;
  if (uVar14 == 0x8000) {
    lVar16 = 0;
    do {
      auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16),auVar32);
      *(undefined1 (*) [16])((long)&c->p + lVar16) = auVar31;
      auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10),auVar32);
      *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10) = auVar31;
      auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20),auVar32);
      *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20) = auVar31;
      auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30),auVar32);
      *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30) = auVar31;
      lVar16 = lVar16 + 0x40;
    } while (lVar16 != 0x40000);
    local_a0 = local_a0 + 0x8000;
    uVar14 = 0;
  }
  uVar23 = (uint)local_70;
  puVar21 = puVar29;
  if (uVar23 < 5) {
LAB_001020f5:
    uVar17 = (ulong)uVar13;
  }
  else {
    uVar10 = (ushort)uVar14;
    uVar26 = uVar10 ^ 0x8000;
    sVar8 = *(short *)((long)&c->p + uVar28 * 2);
    sVar25 = *(short *)((long)&c->p + (ulong)uVar22 * 2 + 0x10000);
    *(ushort *)((long)&c->p + uVar28 * 2) = uVar10;
    *(ushort *)((long)&c->p + (ulong)uVar22 * 2 + 0x10000) = uVar10;
    *(short *)((long)&c->p + (ulong)uVar14 * 2 + 0x30000) = sVar25;
    uVar28 = (ulong)((*(uint *)((long)puVar29 + 1) & 0xffffff) * 0x1e35a7bd >> 0x11);
    uVar22 = *(uint *)((long)puVar29 + 1) * 0x1e35a7bd >> 0x10;
    uVar17 = (ulong)uVar13;
    if (3 < uVar13) {
      if ((uVar13 < local_ac) && ((short)uVar26 < sVar25)) goto LAB_00101fb9;
      goto LAB_001020f5;
    }
    if (sVar8 <= (short)uVar26) goto LAB_001020f5;
    uVar17 = 3;
    if (uVar13 != 3) {
      bVar30 = ((*(uint *)(local_a0 + sVar8) ^ *puVar29) & 0xffffff) != 0;
      puVar21 = (uint *)(local_a0 + sVar8);
      if (bVar30) {
        puVar21 = puVar29;
      }
      uVar17 = (ulong)uVar13;
      if (!bVar30) {
        uVar17 = 3;
      }
    }
    if ((short)uVar26 < sVar25) {
      do {
        uVar18 = uVar18 - 1;
        if (*(uint *)(local_a0 + sVar25) == *puVar29) {
          puVar21 = (uint *)(local_a0 + sVar25);
          iVar15 = 4;
          uVar17 = 4;
          if (0xffffffdf < uVar23 - 0x24) goto LAB_0010214e;
          if (*(ulong *)(puVar21 + 1) != *(ulong *)(puVar29 + 1)) {
            uVar17 = *(ulong *)(puVar29 + 1) ^ *(ulong *)(puVar21 + 1);
            goto LAB_00102196;
          }
          if (*(ulong *)(puVar21 + 3) != *(ulong *)(puVar29 + 3)) {
            uVar17 = *(ulong *)(puVar29 + 3) ^ *(ulong *)(puVar21 + 3);
            iVar15 = 0xc;
            goto LAB_00102196;
          }
          if (*(ulong *)(puVar21 + 5) == *(ulong *)(puVar29 + 5)) {
            uVar17 = 0x24;
            if (*(ulong *)(puVar21 + 7) == *(ulong *)(puVar29 + 7)) goto LAB_0010214e;
            uVar17 = *(ulong *)(puVar29 + 7) ^ *(ulong *)(puVar21 + 7);
            iVar15 = 0x1c;
          }
          else {
            uVar17 = *(ulong *)(puVar29 + 5) ^ *(ulong *)(puVar21 + 5);
            iVar15 = 0x14;
          }
          goto LAB_00102196;
        }
        sVar25 = *(short *)((long)&c->p + (ulong)((int)sVar25 & 0x7fff) * 2 + 0x30000);
      } while (((short)uVar26 < sVar25) && (uVar18 != 0));
    }
  }
  goto LAB_001021dd;
  while( true ) {
    puVar3 = (ulong *)((long)puVar21 + uVar17);
    puVar4 = (ulong *)((long)puVar29 + uVar17);
    uVar17 = (ulong)(iVar15 + 8U);
    if (*puVar3 != *puVar4) break;
LAB_0010214e:
    iVar15 = (int)uVar17;
    if (uVar23 < iVar15 + 8U) goto LAB_0010242b;
  }
  uVar17 = *puVar4 ^ *puVar3;
LAB_00102196:
  uVar27 = 0;
  if (uVar17 != 0) {
    for (; (uVar17 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
    }
  }
  uVar17 = (ulong)(((uint)(uVar27 >> 3) & 0x1fffffff) + iVar15);
LAB_001021a0:
  if (((uint)uVar17 < local_ac) &&
     (sVar25 = *(short *)((long)&c->p + (ulong)((int)sVar25 & 0x7fff) * 2 + 0x30000),
     uVar18 != 0 && (short)uVar26 < sVar25)) {
LAB_00101fb9:
    local_84 = uVar23 - 0x24;
LAB_00101fbe:
    while( true ) {
      uVar18 = uVar18 - 1;
      puVar2 = (uint *)(local_a0 + sVar25);
      if ((*(int *)(((uVar17 & 0xffffffff) - 3) + (long)puVar2) ==
           *(int *)((long)puVar29 + ((uVar17 & 0xffffffff) - 3))) && (*puVar2 == *puVar29)) break;
      sVar25 = *(short *)((long)&c->p + (ulong)((int)sVar25 & 0x7fff) * 2 + 0x30000);
      if ((sVar25 <= (short)uVar26) || (uVar18 == 0)) goto LAB_001021dd;
    }
    iVar15 = 4;
    uVar27 = 4;
    if (local_84 < 0xffffffe0) {
      if (*(ulong *)(puVar2 + 1) == *(ulong *)(puVar29 + 1)) {
        if (*(ulong *)(puVar2 + 3) == *(ulong *)(puVar29 + 3)) {
          if (*(ulong *)(puVar2 + 5) == *(ulong *)(puVar29 + 5)) {
            uVar27 = 0x24;
            if (*(ulong *)(puVar2 + 7) == *(ulong *)(puVar29 + 7)) goto LAB_0010204e;
            uVar27 = *(ulong *)(puVar29 + 7) ^ *(ulong *)(puVar2 + 7);
            iVar15 = 0x1c;
          }
          else {
            uVar27 = *(ulong *)(puVar29 + 5) ^ *(ulong *)(puVar2 + 5);
            iVar15 = 0x14;
          }
        }
        else {
          uVar27 = *(ulong *)(puVar29 + 3) ^ *(ulong *)(puVar2 + 3);
          iVar15 = 0xc;
        }
      }
      else {
        uVar27 = *(ulong *)(puVar29 + 1) ^ *(ulong *)(puVar2 + 1);
      }
    }
    else {
LAB_0010204e:
      do {
        iVar15 = (int)uVar27;
        if (uVar23 < iVar15 + 8U) goto LAB_001020d8;
        puVar3 = (ulong *)((long)puVar2 + uVar27);
        puVar4 = (ulong *)((long)puVar29 + uVar27);
        uVar27 = (ulong)(iVar15 + 8U);
      } while (*puVar3 == *puVar4);
      uVar27 = *puVar4 ^ *puVar3;
    }
    uVar9 = 0;
    if (uVar27 != 0) {
      for (; (uVar27 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
      }
    }
    uVar27 = (ulong)(((uint)(uVar9 >> 3) & 0x1fffffff) + iVar15);
    goto LAB_00102097;
  }
LAB_001021dd:
  uVar14 = (uint)uVar17;
  if (uVar12 <= uVar14) {
    uVar23 = (uint)((long)puVar29 - (long)puVar21);
    if ((3 < uVar14) || (uVar23 < 0x1001)) {
      bVar7 = ""[uVar23 - 1 >> (byte)(0x100 - uVar23 >> 0x1d)];
      puVar6 = (c->freqs).offset + ((ulong)""[uVar17 & 0xffffffff] - 0x1f);
      *puVar6 = *puVar6 + 1;
      uVar23 = (uint)bVar7 + (0x100 - uVar23 >> 0x1d) * 2;
      puVar6 = (c->freqs).offset + uVar23;
      *puVar6 = *puVar6 + 1;
      puVar6 = (c->split_stats).new_observations + (ulong)(8 < uVar14) + 8;
      *puVar6 = *puVar6 + 1;
      puVar6 = &(c->split_stats).num_new_observations;
      *puVar6 = *puVar6 + 1;
      puVar2 = (uint *)((long)(c->freqs).litlen + local_80 + -0x28);
      *puVar2 = *puVar2 | uVar14 << 0x17;
      *(short *)((long)(c->freqs).litlen + local_80 + -0x24) =
           (short)((long)puVar29 - (long)puVar21);
      *(short *)((long)(c->freqs).litlen + local_80 + -0x22) = (short)uVar23;
      *(undefined4 *)((long)(c->freqs).litlen + local_80 + -0x20) = 0;
      pbVar19 = (byte *)((long)puVar29 + 1);
      if ((long)(ulong)(uVar14 + 4) <= (long)puVar20 - (long)pbVar19) {
        iVar15 = uVar14 - 1;
        uVar14 = (int)pbVar19 - (int)local_a0;
        do {
          if (uVar14 == 0x8000) {
            lVar16 = 0;
            do {
              auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16),auVar32);
              *(undefined1 (*) [16])((long)&c->p + lVar16) = auVar31;
              auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10),auVar32);
              *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10) = auVar31;
              auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20),auVar32);
              *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20) = auVar31;
              auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30),auVar32);
              *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30) = auVar31;
              lVar16 = lVar16 + 0x40;
            } while (lVar16 != 0x40000);
            local_a0 = local_a0 + 0x8000;
            uVar14 = 0;
          }
          *(short *)((long)&c->p + uVar28 * 2) = (short)uVar14;
          *(undefined2 *)((long)&c->p + (ulong)uVar14 * 2 + 0x30000) =
               *(undefined2 *)((long)&c->p + (ulong)uVar22 * 2 + 0x10000);
          *(short *)((long)&c->p + (ulong)uVar22 * 2 + 0x10000) = (short)uVar14;
          puVar21 = (uint *)(pbVar19 + 1);
          pbVar19 = pbVar19 + 1;
          uVar28 = (ulong)((*puVar21 & 0xffffff) * 0x1e35a7bd >> 0x11);
          uVar22 = *puVar21 * 0x1e35a7bd >> 0x10;
          uVar14 = uVar14 + 1;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      local_80 = local_80 + 8;
      puVar29 = (uint *)((long)puVar29 + (uVar17 & 0xffffffff));
      goto LAB_001023a8;
    }
  }
  bVar7 = (byte)*puVar29;
  puVar6 = (c->freqs).litlen + bVar7;
  *puVar6 = *puVar6 + 1;
  puVar6 = (c->split_stats).new_observations + ((bVar7 & 1) + (uint)(bVar7 >> 6) * 2);
  *puVar6 = *puVar6 + 1;
  puVar6 = &(c->split_stats).num_new_observations;
  *puVar6 = *puVar6 + 1;
  puVar29 = (uint *)((long)puVar29 + 1);
  piVar5 = (int *)((long)(c->freqs).litlen + local_80 + -0x28);
  *piVar5 = *piVar5 + 1;
LAB_001023a8:
  if ((puVar24 <= puVar29) || (0xa323f < local_80)) {
    local_78 = (int)in;
    uVar17 = (ulong)(uint)((int)puVar29 - local_78);
    goto LAB_00102470;
  }
  if ((((c->split_stats).num_new_observations < 0x200) ||
      (uVar17 = (long)puVar29 - (long)in,
      (long)puVar20 - (long)puVar29 < 5000 || (long)uVar17 < 5000)) ||
     (_Var11 = do_end_block_check(&c->split_stats,(u32)uVar17), auVar32 = _DAT_0010c040, !_Var11))
  goto LAB_00101dea;
LAB_00102470:
  deflate_finish_block(c,os,in,(u32)uVar17,(c->p).g.sequences,puVar29 == puVar20);
  if ((puVar29 == puVar20) || (in = (u8 *)puVar29, os->overflow == true)) {
    return;
  }
  goto LAB_00101d60;
LAB_0010242b:
  for (; (uVar17 < local_70 &&
         (*(byte *)((long)puVar21 + uVar17) == *(byte *)((long)puVar29 + uVar17)));
      uVar17 = uVar17 + 1) {
  }
  goto LAB_001021a0;
LAB_001020d8:
  for (; (uVar27 < local_70 &&
         (local_a0[uVar27 + (long)sVar25] == *(byte *)((long)puVar29 + uVar27)));
      uVar27 = uVar27 + 1) {
  }
LAB_00102097:
  if (((uint)uVar17 < (uint)uVar27) &&
     (uVar17 = uVar27 & 0xffffffff, puVar21 = puVar2, local_ac <= (uint)uVar27)) {
    uVar17 = uVar27 & 0xffffffff;
    goto LAB_001021dd;
  }
  sVar25 = *(short *)((long)&c->p + (ulong)((int)sVar25 & 0x7fff) * 2 + 0x30000);
  if ((sVar25 <= (short)uVar26) || (uVar18 == 0)) goto LAB_001021dd;
  goto LAB_00101fbe;
}

Assistant:

static void
deflate_compress_greedy(struct libdeflate_compressor * restrict c,
			const u8 *in, size_t in_nbytes,
			struct deflate_output_bitstream *os)
{
	const u8 *in_next = in;
	const u8 *in_end = in_next + in_nbytes;
	const u8 *in_cur_base = in_next;
	u32 max_len = DEFLATE_MAX_MATCH_LEN;
	u32 nice_len = MIN(c->nice_match_length, max_len);
	u32 next_hashes[2] = {0, 0};

	hc_matchfinder_init(&c->p.g.hc_mf);

	do {
		/* Starting a new DEFLATE block */

		const u8 * const in_block_begin = in_next;
		const u8 * const in_max_block_end = choose_max_block_end(
				in_next, in_end, SOFT_MAX_BLOCK_LENGTH);
		struct deflate_sequence *seq = c->p.g.sequences;
		u32 min_len;

		init_block_split_stats(&c->split_stats);
		deflate_begin_sequences(c, seq);
		min_len = calculate_min_match_len(in_next,
						  in_max_block_end - in_next,
						  c->max_search_depth);
		do {
			u32 length;
			u32 offset;

			adjust_max_and_nice_len(&max_len, &nice_len,
						in_end - in_next);
			length = hc_matchfinder_longest_match(
						&c->p.g.hc_mf,
						&in_cur_base,
						in_next,
						min_len - 1,
						max_len,
						nice_len,
						c->max_search_depth,
						next_hashes,
						&offset);

			if (length >= min_len &&
			    (length > DEFLATE_MIN_MATCH_LEN ||
			     offset <= 4096)) {
				/* Match found */
				deflate_choose_match(c, length, offset, true,
						     &seq);
				hc_matchfinder_skip_bytes(&c->p.g.hc_mf,
							  &in_cur_base,
							  in_next + 1,
							  in_end,
							  length - 1,
							  next_hashes);
				in_next += length;
			} else {
				/* No match found */
				deflate_choose_literal(c, *in_next++, true,
						       seq);
			}

			/* Check if it's time to output another block. */
		} while (in_next < in_max_block_end &&
			 seq < &c->p.g.sequences[SEQ_STORE_LENGTH] &&
			 !should_end_block(&c->split_stats,
					   in_block_begin, in_next, in_end));

		deflate_finish_block(c, os, in_block_begin,
				     in_next - in_block_begin,
				     c->p.g.sequences, in_next == in_end);
	} while (in_next != in_end && !os->overflow);
}